

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O1

Value * __thiscall
anon_unknown.dwarf_1ca509f::Target::Dump(Value *__return_storage_ptr__,Target *this)

{
  _Rb_tree_node_base *__x;
  _Link_type __k;
  size_type *psVar1;
  size_t *psVar2;
  cmMakefile *pcVar3;
  cmInstallTargetGenerator *this_00;
  pointer __first;
  pointer __last;
  void *pvVar4;
  pointer pSVar5;
  pointer pSVar6;
  long *plVar7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  uint uVar10;
  undefined8 uVar11;
  const_iterator cVar12;
  undefined8 uVar13;
  bool bVar14;
  TargetType TVar15;
  JBTIndex JVar17;
  ArrayIndex si;
  JBTIndex *__cur;
  int iVar16;
  string *psVar18;
  Value *pVVar19;
  cmLocalGenerator *pcVar20;
  string *psVar21;
  vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_> *__x_00;
  OutputInfo *pOVar22;
  undefined8 *puVar23;
  cmValue cVar24;
  cmGlobalGenerator *this_01;
  TargetDependSet *pTVar25;
  _Base_ptr p_Var26;
  iterator iVar27;
  _Rb_tree_node_base *p_Var28;
  _Base_ptr p_Var29;
  byte extraout_var;
  undefined8 uVar30;
  pointer pIVar31;
  pointer pIVar32;
  pointer pIVar33;
  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar34;
  ulong uVar35;
  pointer pJVar36;
  KindedSources *pKVar37;
  pointer pJVar38;
  pointer pJVar39;
  pointer __result;
  long lVar40;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pJVar41;
  _Base_ptr p_Var42;
  _Tp_alloc_type *__alloc;
  ArrayIndex extraout_EDX;
  ArrayIndex extraout_EDX_00;
  JBTIndex bt;
  JBTIndex bt_00;
  string *extraout_RDX;
  string *extraout_RDX_00;
  string *extraout_RDX_01;
  string *extraout_RDX_02;
  string *extraout_RDX_03;
  string *extraout_RDX_04;
  _Rb_tree_header *p_Var43;
  ValueHolder VVar44;
  ValueHolder VVar45;
  pointer pJVar46;
  pointer pJVar47;
  pointer sk;
  pointer value;
  _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
  *this_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar48;
  _Link_type __p;
  size_t __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar49;
  pointer pcVar50;
  iterator iVar51;
  pointer pJVar52;
  IncludeEntry *i;
  _Rb_tree_node_base *p_Var53;
  ulong uVar54;
  _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
  *p_Var55;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pJVar56;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pJVar57;
  Target *this_03;
  pointer pJVar58;
  ValueHolder VVar59;
  ValueHolder VVar60;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pJVar61;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar62;
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  defines;
  string p;
  string obj_dir;
  size_type __dnew;
  Value artifact;
  Value dependencies;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  Value compileGroups;
  Value sourceGroups;
  pointer local_298;
  ValueHolder local_288;
  ValueHolder local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_278;
  size_type local_260;
  ValueHolder local_258;
  _Rb_tree_node_base local_250;
  undefined8 local_230;
  pointer local_228;
  ValueHolder local_220;
  ValueHolder local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  ValueHolder local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  ValueHolder local_1d0;
  ValueHolder local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  undefined1 local_1b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  _Alloc_hider local_180;
  ValueHolder *pVStack_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  pointer local_160;
  vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_158;
  undefined1 local_140 [24];
  pointer pJStack_128;
  pointer local_120;
  __node_base _Stack_118;
  pointer local_110;
  const_iterator cStack_108;
  pointer local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_f0;
  _Base_ptr local_e8;
  ValueHolder local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  ValueHolder local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Rb_tree_node_base *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  Value local_80;
  Value local_58;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  TVar15 = cmGeneratorTarget::GetType(this->GT);
  paVar48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(ulong)TVar15;
  psVar18 = cmGeneratorTarget::GetName_abi_cxx11_(this->GT);
  Json::Value::Value((Value *)&local_1d0,psVar18);
  pVVar19 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar19,(Value *)&local_1d0);
  Json::Value::~Value((Value *)&local_1d0);
  psVar18 = cmState::GetTargetTypeName_abi_cxx11_(TVar15);
  Json::Value::Value((Value *)&local_1d0,psVar18);
  pVVar19 = Json::Value::operator[](__return_storage_ptr__,"type");
  Json::Value::operator=(pVVar19,(Value *)&local_1d0);
  Json::Value::~Value((Value *)&local_1d0);
  psVar18 = &this->TopBuild;
  TargetId((string *)&local_288,this->GT,psVar18);
  Json::Value::Value((Value *)&local_1d0,(String *)&local_288);
  pVVar19 = Json::Value::operator[](__return_storage_ptr__,"id");
  Json::Value::operator=(pVVar19,(Value *)&local_1d0);
  Json::Value::~Value((Value *)&local_1d0);
  if (local_288 != &aStack_278) {
    operator_delete(local_288.string_,(ulong)(aStack_278._M_allocated_capacity + 1));
  }
  Json::Value::Value((Value *)&local_288,objectValue);
  pcVar20 = cmGeneratorTarget::GetLocalGenerator(this->GT);
  psVar21 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(pcVar20);
  cmSystemTools::RelativeIfUnder((string *)&local_258,&this->TopSource,psVar21);
  Json::Value::Value((Value *)&local_1d0,(String *)&local_258);
  pVVar19 = Json::Value::operator[]((Value *)&local_288,"source");
  Json::Value::operator=(pVVar19,(Value *)&local_1d0);
  Json::Value::~Value((Value *)&local_1d0);
  if (local_258 != &local_250._M_parent) {
    operator_delete(local_258.string_,(ulong)((long)&(local_250._M_parent)->_M_color + 1));
  }
  psVar21 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar20);
  cmSystemTools::RelativeIfUnder((string *)&local_258,psVar18,psVar21);
  Json::Value::Value((Value *)&local_1d0,(String *)&local_258);
  pVVar19 = Json::Value::operator[]((Value *)&local_288,"build");
  Json::Value::operator=(pVVar19,(Value *)&local_1d0);
  Json::Value::~Value((Value *)&local_1d0);
  if (local_258 != &local_250._M_parent) {
    operator_delete(local_258.string_,(ulong)((long)&(local_250._M_parent)->_M_color + 1));
  }
  pVVar19 = Json::Value::operator[](__return_storage_ptr__,"paths");
  Json::Value::operator=(pVVar19,(Value *)&local_288);
  Json::Value::~Value((Value *)&local_288);
  bVar14 = cmTarget::GetIsGeneratorProvided(this->GT->Target);
  if (bVar14) {
    Json::Value::Value((Value *)&local_1d0,true);
    pVVar19 = Json::Value::operator[](__return_storage_ptr__,"isGeneratorProvided");
    Json::Value::operator=(pVVar19,(Value *)&local_1d0);
    Json::Value::~Value((Value *)&local_1d0);
  }
  cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&local_1d0);
  AddBacktrace(this,__return_storage_ptr__,(cmListFileBacktrace *)&local_1d0);
  if (local_1c8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8.map_);
  }
  bVar14 = cmTarget::GetHaveInstallRule(this->GT->Target);
  if (bVar14) {
    Json::Value::Value((Value *)&local_220,objectValue);
    Json::Value::Value((Value *)&local_288,objectValue);
    pcVar3 = this->GT->Makefile;
    local_1f8.string_ = &DAT_00000014;
    local_1d0.string_ = (char *)&local_1c0;
    local_1d0.int_ = std::__cxx11::string::_M_create(&local_1d0.uint_,(ulong)&local_1f8);
    local_1c0._M_allocated_capacity._0_4_ = (undefined4)local_1f8.int_;
    local_1c0._M_local_buf[4] = (char)((ulong)local_1f8 >> 0x20);
    local_1c0._M_local_buf[5] = (char)((ulong)local_1f8 >> 0x28);
    local_1c0._M_local_buf[6] = (char)((ulong)local_1f8 >> 0x30);
    local_1c0._M_local_buf[7] = (char)((ulong)local_1f8 >> 0x38);
    builtin_strncpy((char *)local_1d0,"CMAKE_IN",8);
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(local_1d0.map_)->_M_t + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x52505f4c4c415453;
    *(undefined4 *)
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&(local_1d0.map_)->_M_t + 1) = 0x58494645;
    local_1c8.int_ = local_1f8.int_;
    local_1d0.string_[local_1f8.int_] = '\0';
    psVar21 = cmMakefile::GetSafeDefinition(pcVar3,(string *)&local_1d0);
    local_258.string_ = (char *)&local_250._M_parent;
    pcVar50 = (psVar21->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,pcVar50,pcVar50 + psVar21->_M_string_length);
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0.string_,
                      CONCAT17(local_1c0._M_local_buf[7],
                               CONCAT16(local_1c0._M_local_buf[6],
                                        CONCAT15(local_1c0._M_local_buf[5],
                                                 CONCAT14(local_1c0._M_local_buf[4],
                                                          local_1c0._M_allocated_capacity._0_4_))))
                      + 1);
    }
    cmsys::SystemTools::ConvertToUnixSlashes((string *)&local_258);
    Json::Value::Value((Value *)&local_1d0,(String *)&local_258);
    pVVar19 = Json::Value::operator[]((Value *)&local_288,"path");
    Json::Value::operator=(pVVar19,(Value *)&local_1d0);
    Json::Value::~Value((Value *)&local_1d0);
    if (local_258 != &local_250._M_parent) {
      operator_delete(local_258.string_,(ulong)((long)&(local_250._M_parent)->_M_color + 1));
    }
    pVVar19 = Json::Value::operator[]((Value *)&local_220,"prefix");
    Json::Value::operator=(pVVar19,(Value *)&local_288);
    Json::Value::~Value((Value *)&local_288);
    Json::Value::Value((Value *)&local_258,arrayValue);
    local_f8 = paVar48;
    __x_00 = cmTarget::GetInstallGenerators(this->GT->Target);
    std::vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>::vector
              ((vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_> *)
               &local_e0,__x_00);
    paVar48 = local_d8;
    if (local_e0 != local_d8) {
      VVar45 = local_e0;
      do {
        this_00 = *(cmInstallTargetGenerator **)VVar45.string_;
        Json::Value::Value((Value *)&local_288,objectValue);
        cmInstallTargetGenerator::GetDestination((string *)&local_1f8,this_00,this->Config);
        Json::Value::Value((Value *)&local_1d0,(String *)&local_1f8);
        pVVar19 = Json::Value::operator[]((Value *)&local_288,"path");
        Json::Value::operator=(pVVar19,(Value *)&local_1d0);
        Json::Value::~Value((Value *)&local_1d0);
        if (local_1f8 != &local_1e8) {
          operator_delete(local_1f8.string_,local_1e8._M_allocated_capacity + 1);
        }
        AddBacktrace(this,(Value *)&local_288,&(this_00->super_cmInstallGenerator).Backtrace);
        Json::Value::append((Value *)&local_258,(Value *)&local_288);
        Json::Value::~Value((Value *)&local_288);
        VVar45.string_ =
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(VVar45.map_)->_M_t)->_M_local_buf + 8;
      } while (VVar45 != paVar48);
    }
    if (local_e0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_e0.string_,local_d0._M_allocated_capacity - (long)local_e0);
    }
    pVVar19 = Json::Value::operator[]((Value *)&local_220,"destinations");
    paVar48 = local_f8;
    Json::Value::operator=(pVVar19,(Value *)&local_258);
    Json::Value::~Value((Value *)&local_258);
    pVVar19 = Json::Value::operator[](__return_storage_ptr__,"install");
    Json::Value::operator=(pVVar19,(Value *)&local_220);
    Json::Value::~Value((Value *)&local_220);
  }
  bVar14 = cmGeneratorTarget::HaveWellDefinedOutputFiles(this->GT);
  if (bVar14) {
    Json::Value::Value((Value *)&local_258,arrayValue);
    TVar15 = cmGeneratorTarget::GetType(this->GT);
    if (TVar15 == OBJECT_LIBRARY) {
      bVar14 = cmTarget::HasKnownObjectFileLocation(this->GT->Target,(string *)0x0);
      if (bVar14) {
        local_b8.int_ = 0;
        paStack_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
        local_a8._M_allocated_capacity = 0;
        cmGeneratorTarget::GetObjectSources
                  (this->GT,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                            &local_b8,this->Config);
        local_f8 = paVar48;
        cmGeneratorTarget::GetObjectDirectory((string *)&local_220,this->GT,this->Config);
        paVar48 = paStack_b0;
        if (local_b8 != paStack_b0) {
          VVar45 = local_b8;
          do {
            psVar21 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                                (this->GT,*(cmSourceFile **)VVar45.string_);
            Json::Value::Value((Value *)&local_1d0,objectValue);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_220,psVar21);
            cmSystemTools::RelativeIfUnder((string *)&local_1f8,psVar18,(string *)&local_e0);
            Json::Value::Value((Value *)&local_288,(String *)&local_1f8);
            pVVar19 = Json::Value::operator[]((Value *)&local_1d0,"path");
            Json::Value::operator=(pVVar19,(Value *)&local_288);
            Json::Value::~Value((Value *)&local_288);
            if (local_1f8 != &local_1e8) {
              operator_delete(local_1f8.string_,local_1e8._M_allocated_capacity + 1);
            }
            if (local_e0 != &local_d0) {
              operator_delete(local_e0.string_,(ulong)(local_d0._M_allocated_capacity + 1));
            }
            Json::Value::append((Value *)&local_258,(Value *)&local_1d0);
            Json::Value::~Value((Value *)&local_1d0);
            VVar45.string_ =
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&(VVar45.map_)->_M_t)->_M_local_buf + 8;
          } while (VVar45 != paVar48);
        }
        paVar48 = local_f8;
        if (local_220 != &local_210) {
          operator_delete(local_220.string_,CONCAT71(local_210._1_7_,local_210._M_local_buf[0]) + 1)
          ;
        }
        if (local_b8 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_b8.string_,local_a8._M_allocated_capacity - (long)local_b8);
        }
      }
    }
    else {
      Json::Value::Value((Value *)&local_1d0,objectValue);
      cmGeneratorTarget::GetFullPath
                ((string *)&local_1f8,this->GT,this->Config,RuntimeBinaryArtifact,false);
      cmSystemTools::RelativeIfUnder((string *)&local_220,psVar18,(string *)&local_1f8);
      Json::Value::Value((Value *)&local_288,(String *)&local_220);
      pVVar19 = Json::Value::operator[]((Value *)&local_1d0,"path");
      Json::Value::operator=(pVVar19,(Value *)&local_288);
      Json::Value::~Value((Value *)&local_288);
      if (local_220 != &local_210) {
        operator_delete(local_220.string_,CONCAT71(local_210._1_7_,local_210._M_local_buf[0]) + 1);
      }
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8.string_,local_1e8._M_allocated_capacity + 1);
      }
      Json::Value::append((Value *)&local_258,(Value *)&local_1d0);
      Json::Value::~Value((Value *)&local_1d0);
      bVar14 = cmGeneratorTarget::HasImportLibrary(this->GT,this->Config);
      if (bVar14) {
        Json::Value::Value((Value *)&local_1d0,objectValue);
        cmGeneratorTarget::GetFullPath
                  ((string *)&local_1f8,this->GT,this->Config,ImportLibraryArtifact,false);
        cmSystemTools::RelativeIfUnder((string *)&local_220,psVar18,(string *)&local_1f8);
        Json::Value::Value((Value *)&local_288,(String *)&local_220);
        pVVar19 = Json::Value::operator[]((Value *)&local_1d0,"path");
        Json::Value::operator=(pVVar19,(Value *)&local_288);
        Json::Value::~Value((Value *)&local_288);
        if (local_220 != &local_210) {
          operator_delete(local_220.string_,CONCAT71(local_210._1_7_,local_210._M_local_buf[0]) + 1)
          ;
        }
        if (local_1f8 != &local_1e8) {
          operator_delete(local_1f8.string_,local_1e8._M_allocated_capacity + 1);
        }
        Json::Value::append((Value *)&local_258,(Value *)&local_1d0);
        Json::Value::~Value((Value *)&local_1d0);
      }
      bVar14 = cmGeneratorTarget::IsDLLPlatform(this->GT);
      if ((((bVar14) && (TVar15 = cmGeneratorTarget::GetType(this->GT), TVar15 != STATIC_LIBRARY))
          && (pOVar22 = cmGeneratorTarget::GetOutputInfo(this->GT,this->Config),
             pOVar22 != (OutputInfo *)0x0)) && ((pOVar22->PdbDir)._M_string_length != 0)) {
        Json::Value::Value((Value *)&local_1d0,objectValue);
        pcVar50 = (pOVar22->PdbDir)._M_dataplus._M_p;
        local_e0.string_ = (char *)&local_d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,pcVar50,pcVar50 + (pOVar22->PdbDir)._M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)&local_e0,(ulong)local_d8,0,'\x01');
        cmGeneratorTarget::GetPDBName((string *)&local_b8,this->GT,this->Config);
        uVar30 = (char *)0xf;
        if (local_e0 != &local_d0) {
          uVar30 = local_d0._M_allocated_capacity;
        }
        if ((ulong)uVar30 < paStack_b0->_M_local_buf + (long)local_d8->_M_local_buf) {
          uVar30 = (char *)0xf;
          if (local_b8 != &local_a8) {
            uVar30 = local_a8._M_allocated_capacity;
          }
          if ((ulong)uVar30 < paStack_b0->_M_local_buf + (long)local_d8->_M_local_buf)
          goto LAB_00482b8b;
          puVar23 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,local_e0.uint_);
        }
        else {
LAB_00482b8b:
          puVar23 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_e0.int_,local_b8.uint_);
        }
        paVar49 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar23 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar23 == paVar49) {
          local_1e8._M_allocated_capacity = paVar49->_M_allocated_capacity;
          local_1e8._8_8_ = puVar23[3];
          local_1f8.string_ = (char *)&local_1e8;
        }
        else {
          local_1e8._M_allocated_capacity = paVar49->_M_allocated_capacity;
          local_1f8.map_ = ((ObjectValues *)*puVar23).map_;
        }
        local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar23[1];
        *puVar23 = paVar49;
        puVar23[1] = 0;
        paVar49->_M_local_buf[0] = '\0';
        cmSystemTools::RelativeIfUnder((string *)&local_220,psVar18,(string *)&local_1f8);
        Json::Value::Value((Value *)&local_288,(String *)&local_220);
        pVVar19 = Json::Value::operator[]((Value *)&local_1d0,"path");
        Json::Value::operator=(pVVar19,(Value *)&local_288);
        Json::Value::~Value((Value *)&local_288);
        if (local_220 != &local_210) {
          operator_delete(local_220.string_,CONCAT71(local_210._1_7_,local_210._M_local_buf[0]) + 1)
          ;
        }
        if (local_1f8 != &local_1e8) {
          operator_delete(local_1f8.string_,local_1e8._M_allocated_capacity + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8.string_,(ulong)(local_a8._M_allocated_capacity + 1));
        }
        if (local_e0 != &local_d0) {
          operator_delete(local_e0.string_,(ulong)(local_d0._M_allocated_capacity + 1));
        }
        Json::Value::append((Value *)&local_258,(Value *)&local_1d0);
        Json::Value::~Value((Value *)&local_1d0);
      }
    }
    bVar14 = Json::Value::empty((Value *)&local_258);
    if (!bVar14) {
      pVVar19 = Json::Value::operator[](__return_storage_ptr__,"artifacts");
      Json::Value::operator=(pVVar19,(Value *)&local_258);
    }
    Json::Value::~Value((Value *)&local_258);
  }
  iVar16 = (int)paVar48;
  if (iVar16 - 2U < 2) {
LAB_00482d47:
    cmGeneratorTarget::GetFullName((string *)&local_288,this->GT,this->Config,RuntimeBinaryArtifact)
    ;
    Json::Value::Value((Value *)&local_1d0,(String *)&local_288);
    pVVar19 = Json::Value::operator[](__return_storage_ptr__,"nameOnDisk");
    Json::Value::operator=(pVVar19,(Value *)&local_1d0);
    Json::Value::~Value((Value *)&local_1d0);
    if (local_288 != &aStack_278) {
      operator_delete(local_288.string_,(ulong)(aStack_278._M_allocated_capacity + 1));
    }
    Json::Value::Value((Value *)&local_288,objectValue);
    cmGeneratorTarget::GetLinkerLanguage((string *)&local_258,this->GT,this->Config);
    Json::Value::Value((Value *)&local_1d0,(String *)&local_258);
    pVVar19 = Json::Value::operator[]((Value *)&local_288,"language");
    Json::Value::operator=(pVVar19,(Value *)&local_1d0);
    Json::Value::~Value((Value *)&local_1d0);
    DumpLinkCommandFragments((Value *)&local_1d0,this);
    bVar14 = Json::Value::empty((Value *)&local_1d0);
    if (!bVar14) {
      pVVar19 = Json::Value::operator[]((Value *)&local_288,"commandFragments");
      Json::Value::operator=(pVVar19,(Value *)&local_1d0);
    }
    Json::Value::~Value((Value *)&local_1d0);
    pcVar3 = this->GT->Makefile;
    local_220.int_ = 0x12;
    local_1d0.string_ = (char *)&local_1c0;
    local_1d0.int_ = std::__cxx11::string::_M_create(&local_1d0.uint_,(ulong)&local_220);
    local_1c0._M_allocated_capacity._0_4_ = (undefined4)local_220.int_;
    local_1c0._M_local_buf[4] = (char)((ulong)local_220 >> 0x20);
    local_1c0._M_local_buf[5] = (char)((ulong)local_220 >> 0x28);
    local_1c0._M_local_buf[6] = (char)((ulong)local_220 >> 0x30);
    local_1c0._M_local_buf[7] = (char)((ulong)local_220 >> 0x38);
    builtin_strncpy((char *)local_1d0,"CMAKE_SY",8);
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(local_1d0.map_)->_M_t + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x494c5f544f4f5253;
    *(undefined2 *)
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&(local_1d0.map_)->_M_t + 1) = 0x4b4e;
    local_1c8.int_ = local_220.int_;
    local_1d0.string_[local_220.string_] = '\0';
    cVar24 = cmMakefile::GetDefinition(pcVar3,(string *)&local_1d0);
    psVar21 = extraout_RDX;
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0.string_,
                      CONCAT17(local_1c0._M_local_buf[7],
                               CONCAT16(local_1c0._M_local_buf[6],
                                        CONCAT15(local_1c0._M_local_buf[5],
                                                 CONCAT14(local_1c0._M_local_buf[4],
                                                          local_1c0._M_allocated_capacity._0_4_))))
                      + 1);
      psVar21 = extraout_RDX_00;
    }
    if (cVar24.Value == (string *)0x0) {
      local_1c0._M_allocated_capacity._0_4_ = 0x4b414d43;
      local_1c0._M_local_buf[4] = 'E';
      local_1c0._M_local_buf[5] = '_';
      local_1c0._M_local_buf[6] = 'S';
      local_1c0._M_local_buf[7] = 'Y';
      local_1c0._8_5_ = 0x544f4f5253;
      local_1c8.int_ = 0xd;
      local_1c0._M_local_buf[0xd] = '\0';
      local_1d0.string_ = (char *)&local_1c0;
      cVar24 = cmMakefile::GetDefinition(this->GT->Makefile,(string *)&local_1d0);
      psVar21 = extraout_RDX_01;
      if (local_1d0 != &local_1c0) {
        operator_delete(local_1d0.string_,
                        CONCAT17(local_1c0._M_local_buf[7],
                                 CONCAT16(local_1c0._M_local_buf[6],
                                          CONCAT15(local_1c0._M_local_buf[5],
                                                   CONCAT14(local_1c0._M_local_buf[4],
                                                            local_1c0._M_allocated_capacity._0_4_)))
                                ) + 1);
        psVar21 = extraout_RDX_02;
      }
      if (cVar24.Value != (string *)0x0) {
        DumpSysroot((Value *)&local_1d0,(Target *)cVar24.Value,psVar21);
        pVVar19 = Json::Value::operator[]((Value *)&local_288,"sysroot");
        goto LAB_00482fad;
      }
    }
    else {
      DumpSysroot((Value *)&local_1d0,(Target *)cVar24.Value,psVar21);
      pVVar19 = Json::Value::operator[]((Value *)&local_288,"sysroot");
LAB_00482fad:
      Json::Value::operator=(pVVar19,(Value *)&local_1d0);
      Json::Value::~Value((Value *)&local_1d0);
    }
    bVar14 = cmGeneratorTarget::IsIPOEnabled(this->GT,(string *)&local_258,this->Config);
    if (bVar14) {
      Json::Value::Value((Value *)&local_1d0,true);
      pVVar19 = Json::Value::operator[]((Value *)&local_288,"lto");
      Json::Value::operator=(pVVar19,(Value *)&local_1d0);
      Json::Value::~Value((Value *)&local_1d0);
    }
    if (local_258 != &local_250._M_parent) {
      operator_delete(local_258.string_,(ulong)((long)&(local_250._M_parent)->_M_color + 1));
    }
    pVVar19 = Json::Value::operator[](__return_storage_ptr__,"link");
  }
  else {
    if (iVar16 != 1) {
      if (iVar16 != 0) goto LAB_004831ce;
      goto LAB_00482d47;
    }
    cmGeneratorTarget::GetFullName((string *)&local_288,this->GT,this->Config,RuntimeBinaryArtifact)
    ;
    Json::Value::Value((Value *)&local_1d0,(String *)&local_288);
    pVVar19 = Json::Value::operator[](__return_storage_ptr__,"nameOnDisk");
    Json::Value::operator=(pVVar19,(Value *)&local_1d0);
    Json::Value::~Value((Value *)&local_1d0);
    if (local_288 != &aStack_278) {
      operator_delete(local_288.string_,(ulong)(aStack_278._M_allocated_capacity + 1));
    }
    Json::Value::Value((Value *)&local_288,objectValue);
    DumpLinkCommandFragments((Value *)&local_1d0,this);
    bVar14 = Json::Value::empty((Value *)&local_1d0);
    if (!bVar14) {
      pVVar19 = Json::Value::operator[]((Value *)&local_288,"commandFragments");
      Json::Value::operator=(pVVar19,(Value *)&local_1d0);
    }
    Json::Value::~Value((Value *)&local_1d0);
    cmGeneratorTarget::GetLinkerLanguage((string *)&local_258,this->GT,this->Config);
    bVar14 = cmGeneratorTarget::IsIPOEnabled(this->GT,(string *)&local_258,this->Config);
    if (bVar14) {
      Json::Value::Value((Value *)&local_1d0,true);
      pVVar19 = Json::Value::operator[]((Value *)&local_288,"lto");
      Json::Value::operator=(pVVar19,(Value *)&local_1d0);
      Json::Value::~Value((Value *)&local_1d0);
    }
    if (local_258 != &local_250._M_parent) {
      operator_delete(local_258.string_,(ulong)((long)&(local_250._M_parent)->_M_color + 1));
    }
    pVVar19 = Json::Value::operator[](__return_storage_ptr__,"archive");
  }
  Json::Value::operator=(pVVar19,(Value *)&local_288);
  Json::Value::~Value((Value *)&local_288);
LAB_004831ce:
  Json::Value::Value((Value *)&local_e0,arrayValue);
  this_01 = cmGeneratorTarget::GetGlobalGenerator(this->GT);
  pTVar25 = cmGlobalGenerator::GetTargetDirectDepends(this_01,this->GT);
  p_Var26 = (pTVar25->
            super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
            _M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var43 = &(pTVar25->
             super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
             _M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var26 != p_Var43) {
    do {
      Json::Value::Value((Value *)&local_288,objectValue);
      TargetId((string *)&local_258,*(cmGeneratorTarget **)(p_Var26 + 1),psVar18);
      Json::Value::Value((Value *)&local_1d0,(String *)&local_258);
      pVVar19 = Json::Value::operator[]((Value *)&local_288,"id");
      Json::Value::operator=(pVVar19,(Value *)&local_1d0);
      Json::Value::~Value((Value *)&local_1d0);
      if (local_258 != &local_250._M_parent) {
        operator_delete(local_258.string_,(ulong)((long)&(local_250._M_parent)->_M_color + 1));
      }
      AddBacktrace(this,(Value *)&local_288,(cmListFileBacktrace *)&p_Var26[1]._M_left);
      Json::Value::append((Value *)&local_e0,(Value *)&local_288);
      Json::Value::~Value((Value *)&local_288);
      p_Var26 = (_Base_ptr)std::_Rb_tree_increment(p_Var26);
    } while ((_Rb_tree_header *)p_Var26 != p_Var43);
  }
  bVar14 = Json::Value::empty((Value *)&local_e0);
  if (!bVar14) {
    pVVar19 = Json::Value::operator[](__return_storage_ptr__,"dependencies");
    Json::Value::operator=(pVVar19,(Value *)&local_e0);
  }
  local_250._M_color = _S_red;
  local_250._M_parent = (_Base_ptr)0x0;
  local_230 = 0;
  local_250._M_left = &local_250;
  local_250._M_right = &local_250;
  cmGeneratorTarget::GetLanguages
            (this->GT,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_258,this->Config);
  if (local_250._M_left != &local_250) {
    local_228 = (pointer)&this->CompileDataMap;
    local_e8 = &(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&this->Backtraces;
    p_Var26 = local_250._M_left;
    do {
      __x = p_Var26 + 1;
      local_90 = p_Var26;
      iVar27 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
               ::lower_bound((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                              *)local_228,(key_type *)__x);
      if ((iVar27._M_node == local_e8) ||
         (iVar16 = std::__cxx11::string::compare((string *)__x), iVar16 < 0)) {
        p_Var28 = (_Rb_tree_node_base *)operator_new(0x118);
        __k = (_Link_type)(p_Var28 + 1);
        *(_Base_ptr **)(p_Var28 + 1) = &p_Var28[1]._M_left;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__k,*(long *)(local_90 + 1),
                   (long)&(local_90[1]._M_parent)->_M_color + *(long *)(local_90 + 1));
        memset(p_Var28 + 2,0,0xd8);
        *(_Base_ptr **)(p_Var28 + 2) = &p_Var28[2]._M_left;
        p_Var28[2]._M_parent = (_Base_ptr)0x0;
        *(undefined1 *)&p_Var28[2]._M_left = 0;
        *(_Base_ptr **)(p_Var28 + 3) = &p_Var28[3]._M_left;
        p_Var28[3]._M_parent = (_Base_ptr)0x0;
        *(undefined1 *)&p_Var28[3]._M_left = 0;
        local_1d0.string_ = (char *)&local_1c0;
        uVar10 = (uint)local_1c0._M_allocated_capacity._0_4_ >> 8;
        local_1c0._M_allocated_capacity._0_4_ = uVar10 << 8;
        *(_Base_ptr **)(p_Var28 + 4) = &p_Var28[4]._M_left;
        p_Var28[4]._M_left =
             (_Base_ptr)
             CONCAT17(local_1c0._M_local_buf[7],
                      CONCAT16(local_1c0._M_local_buf[6],
                               CONCAT15(local_1c0._M_local_buf[5],
                                        CONCAT14(local_1c0._M_local_buf[4],
                                                 local_1c0._M_allocated_capacity._0_4_))));
        p_Var28[4]._M_right =
             (_Base_ptr)
             CONCAT26(local_1c0._14_2_,CONCAT15(local_1c0._M_local_buf[0xd],local_1c0._8_5_));
        p_Var28[4]._M_parent = (_Base_ptr)0x0;
        local_1c8.int_ = 0;
        local_1c0._M_allocated_capacity._0_4_ = uVar10 << 8;
        p_Var28[8]._M_left = (_Base_ptr)0x0;
        *(undefined8 *)(p_Var28 + 8) = 0;
        p_Var28[8]._M_parent = (_Base_ptr)0x0;
        p_Var28[7]._M_left = (_Base_ptr)0x0;
        p_Var28[7]._M_right = (_Base_ptr)0x0;
        *(undefined8 *)(p_Var28 + 7) = 0;
        p_Var28[7]._M_parent = (_Base_ptr)0x0;
        p_Var28[6]._M_left = (_Base_ptr)0x0;
        p_Var28[6]._M_right = (_Base_ptr)0x0;
        *(undefined8 *)(p_Var28 + 6) = 0;
        p_Var28[6]._M_parent = (_Base_ptr)0x0;
        p_Var28[5]._M_left = (_Base_ptr)0x0;
        p_Var28[5]._M_right = (_Base_ptr)0x0;
        *(undefined8 *)(p_Var28 + 5) = 0;
        p_Var28[5]._M_parent = (_Base_ptr)0x0;
        if (iVar27._M_node == local_e8) {
          if (((this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
             (__p = __k,
             iVar16 = std::__cxx11::string::compare
                                ((string *)
                                 ((this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_right + 1)), -1 < iVar16)) {
LAB_004835a1:
            __p = __k;
            pVar62 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                     ::_M_get_insert_unique_pos
                               ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                                 *)local_228,(key_type *)__k);
          }
          else {
            p_Var29 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
LAB_004835ae:
            auVar8._8_8_ = 0;
            auVar8._0_8_ = p_Var29;
            pVar62 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar8 << 0x40);
          }
        }
        else {
          __p = (_Link_type)(iVar27._M_node + 1);
          iVar16 = std::__cxx11::string::compare((string *)__k);
          if (iVar16 < 0) {
            p_Var29 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            pVar62.second = p_Var29;
            pVar62.first = p_Var29;
            if (p_Var29 != iVar27._M_node) {
              p_Var29 = (_Base_ptr)std::_Rb_tree_decrement(iVar27._M_node);
              __p = __k;
              iVar16 = std::__cxx11::string::compare((string *)(p_Var29 + 1));
              if (-1 < iVar16) goto LAB_004835a1;
              iVar51 = iVar27;
              if (p_Var29->_M_right == (_Base_ptr)0x0) {
                iVar51._M_node = (_Base_ptr)0x0;
                iVar27._M_node = p_Var29;
              }
LAB_004835d3:
              pVar62.second = iVar27._M_node;
              pVar62.first = iVar51._M_node;
            }
          }
          else {
            __p = __k;
            iVar16 = std::__cxx11::string::compare((string *)(iVar27._M_node + 1));
            if (iVar16 < 0) {
              p_Var29 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
              ;
              if (p_Var29 == iVar27._M_node) goto LAB_004835ae;
              p_Var29 = (_Base_ptr)std::_Rb_tree_increment(iVar27._M_node);
              __p = (_Link_type)(p_Var29 + 1);
              iVar16 = std::__cxx11::string::compare((string *)__k);
              if (iVar16 < 0) {
                iVar51._M_node = (iVar27._M_node)->_M_right;
                if ((iVar27._M_node)->_M_right != (_Base_ptr)0x0) {
                  iVar51._M_node = p_Var29;
                  iVar27._M_node = p_Var29;
                }
                goto LAB_004835d3;
              }
              goto LAB_004835a1;
            }
            pVar62.second = (_Rb_tree_node_base *)0x0;
            pVar62.first = iVar27._M_node;
          }
        }
        p_Var53 = pVar62.second;
        iVar27._M_node = pVar62.first;
        if (p_Var53 == (_Rb_tree_node_base *)0x0) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
          ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                          *)p_Var28,__p);
        }
        else {
          bVar14 = true;
          if ((iVar27._M_node == (_Base_ptr)0x0) && (local_e8 != p_Var53)) {
            std::__cxx11::string::compare((string *)__k);
            bVar14 = (bool)(extraout_var >> 7);
          }
          std::_Rb_tree_insert_and_rebalance(bVar14,p_Var28,p_Var53,local_e8);
          psVar2 = &(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          *psVar2 = *psVar2 + 1;
          iVar27._M_node = p_Var28;
        }
      }
      std::__cxx11::string::_M_assign((string *)(iVar27._M_node + 2));
      pcVar3 = this->GT->Makefile;
      local_288.int_ = 0x15;
      local_1d0.string_ = (char *)&local_1c0;
      local_1d0.int_ = std::__cxx11::string::_M_create(&local_1d0.uint_,(ulong)&local_288);
      local_1c0._M_allocated_capacity._0_4_ = (undefined4)local_288.int_;
      local_1c0._M_local_buf[4] = (char)((ulong)local_288 >> 0x20);
      local_1c0._M_local_buf[5] = (char)((ulong)local_288 >> 0x28);
      local_1c0._M_local_buf[6] = (char)((ulong)local_288 >> 0x30);
      local_1c0._M_local_buf[7] = (char)((ulong)local_288 >> 0x38);
      builtin_strncpy((char *)local_1d0,"CMAKE_SY",8);
      builtin_strncpy((char *)((long)&(local_1d0.map_)->_M_t + 8),"SROOT_CO",8);
      builtin_strncpy((char *)((long)&(local_1d0.map_)->_M_t + 0xd),"_COMPILE",8);
      local_1c8.int_ = local_288.int_;
      local_1d0.string_[local_288.string_] = '\0';
      cVar24 = cmMakefile::GetDefinition(pcVar3,(string *)&local_1d0);
      if (local_1d0 != &local_1c0) {
        operator_delete(local_1d0.string_,
                        CONCAT17(local_1c0._M_local_buf[7],
                                 CONCAT16(local_1c0._M_local_buf[6],
                                          CONCAT15(local_1c0._M_local_buf[5],
                                                   CONCAT14(local_1c0._M_local_buf[4],
                                                            local_1c0._M_allocated_capacity._0_4_)))
                                ) + 1);
      }
      if (cVar24.Value == (string *)0x0) {
        local_1c0._8_5_ = 0x544f4f5253;
        local_1c0._M_allocated_capacity._0_4_ = 0x4b414d43;
        local_1c0._M_local_buf[4] = 'E';
        local_1c0._M_local_buf[5] = '_';
        local_1c0._M_local_buf[6] = 'S';
        local_1c0._M_local_buf[7] = 'Y';
        local_1c8.int_ = 0xd;
        local_1c0._M_local_buf[0xd] = '\0';
        local_1d0.string_ = (char *)&local_1c0;
        cVar24 = cmMakefile::GetDefinition(this->GT->Makefile,(string *)&local_1d0);
        if (local_1d0 != &local_1c0) {
          operator_delete(local_1d0.string_,
                          CONCAT17(local_1c0._M_local_buf[7],
                                   CONCAT16(local_1c0._M_local_buf[6],
                                            CONCAT15(local_1c0._M_local_buf[5],
                                                     CONCAT14(local_1c0._M_local_buf[4],
                                                              local_1c0._M_allocated_capacity._0_4_)
                                                    ))) + 1);
        }
        if (cVar24.Value != (string *)0x0) goto LAB_00483763;
      }
      else {
LAB_00483763:
        std::__cxx11::string::_M_assign((string *)(iVar27._M_node + 3));
      }
      pcVar20 = cmGeneratorTarget::GetLocalGenerator(this->GT);
      local_1c8.int_ = 0;
      local_1c0._M_allocated_capacity._0_4_ = local_1c0._M_allocated_capacity._0_4_ & 0xffffff00;
      local_1d0.string_ = (char *)&local_1c0;
      cmLocalGenerator::GetTargetCompileFlags
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_288,pcVar20,this->GT,this->Config,(string *)__x,(string *)&local_1d0);
      if (local_1d0 != &local_1c0) {
        operator_delete(local_1d0.string_,
                        CONCAT17(local_1c0._M_local_buf[7],
                                 CONCAT16(local_1c0._M_local_buf[6],
                                          CONCAT15(local_1c0._M_local_buf[5],
                                                   CONCAT14(local_1c0._M_local_buf[4],
                                                            local_1c0._M_allocated_capacity._0_4_)))
                                ) + 1);
      }
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::reserve((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&iVar27._M_node[5]._M_right,
                ((long)local_280.string_ - (long)local_288 >> 4) * -0x5555555555555555);
      VVar45 = local_280;
      for (VVar44 = local_288; VVar44.int_ != VVar45.int_;
          VVar44.string_ = (char *)(VVar44.int_ + 0x30)) {
        (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                  ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1d0,this,
                   (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)VVar44.map_);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&iVar27._M_node[5]._M_right,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1d0);
        if (local_1d0 != &local_1c0) {
          operator_delete(local_1d0.string_,
                          CONCAT17(local_1c0._M_local_buf[7],
                                   CONCAT16(local_1c0._M_local_buf[6],
                                            CONCAT15(local_1c0._M_local_buf[5],
                                                     CONCAT14(local_1c0._M_local_buf[4],
                                                              local_1c0._M_allocated_capacity._0_4_)
                                                    ))) + 1);
        }
      }
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_288);
      cmLocalGenerator::GetTargetDefines
                ((set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_288,pcVar20,this->GT,this->Config,(string *)__x);
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::reserve((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&iVar27._M_node[6]._M_left,local_260);
      for (uVar30 = aStack_278._8_8_; (ValueHolder *)uVar30 != &local_280;
          uVar30 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar30)) {
        (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                  ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1d0,this,
                   (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(uVar30 + 0x20));
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&iVar27._M_node[6]._M_left,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1d0);
        if (local_1d0 != &local_1c0) {
          operator_delete(local_1d0.string_,
                          CONCAT17(local_1c0._M_local_buf[7],
                                   CONCAT16(local_1c0._M_local_buf[6],
                                            CONCAT15(local_1c0._M_local_buf[5],
                                                     CONCAT14(local_1c0._M_local_buf[4],
                                                              local_1c0._M_allocated_capacity._0_4_)
                                                    ))) + 1);
        }
      }
      cmLocalGenerator::GetIncludeDirectories
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_1f8,pcVar20,this->GT,(string *)__x,this->Config);
      local_f8 = local_1f0;
      if (local_1f8 != local_1f0) {
        local_f0 = (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(iVar27._M_node + 8);
        VVar45 = local_1f8;
        do {
          (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                    ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1d0,this,
                     (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)VVar45.map_);
          p_Var28 = __x;
          bVar14 = cmGeneratorTarget::IsSystemIncludeDirectory
                             (this->GT,VVar45,this->Config,(string *)__x);
          local_220.bool_ = bVar14;
          pIVar33 = (pointer)iVar27._M_node[8]._M_parent;
          if (pIVar33 == (pointer)iVar27._M_node[8]._M_left) {
            __n = 1;
            p_Var55 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                       *)std::
                         vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                         ::_M_check_len((vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                                         *)local_f0,1,"vector::_M_realloc_insert");
            __first = *(pointer *)(iVar27._M_node + 8);
            __last = (pointer)iVar27._M_node[8]._M_parent;
            pIVar31 = std::
                      _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                      ::_M_allocate(p_Var55,__n);
            std::allocator_traits<std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
            ::
            construct<(anonymous_namespace)::CompileData::IncludeEntry,(anonymous_namespace)::JBT<std::__cxx11::string>,bool>
                      ((allocator_type *)(((long)pIVar33 - (long)__first) + (long)pIVar31),
                       (IncludeEntry *)&local_1d0,
                       (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_220,(bool *)p_Var28);
            pIVar32 = std::
                      vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                      ::_S_relocate(__first,pIVar33,pIVar31,(_Tp_alloc_type *)p_Var28);
            pIVar33 = std::
                      vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                      ::_S_relocate(pIVar33,__last,pIVar32 + 1,(_Tp_alloc_type *)p_Var28);
            if (__first != (pointer)0x0) {
              operator_delete(__first,(long)iVar27._M_node[8]._M_left - (long)__first);
            }
            *(pointer *)(iVar27._M_node + 8) = pIVar31;
            iVar27._M_node[8]._M_parent = (_Base_ptr)pIVar33;
            iVar27._M_node[8]._M_left = (_Base_ptr)(pIVar31 + (long)p_Var55);
          }
          else {
            std::allocator_traits<std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
            ::
            construct<(anonymous_namespace)::CompileData::IncludeEntry,(anonymous_namespace)::JBT<std::__cxx11::string>,bool>
                      ((allocator_type *)pIVar33,(IncludeEntry *)&local_1d0,
                       (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_220,(bool *)p_Var28);
            iVar27._M_node[8]._M_parent = (_Base_ptr)&iVar27._M_node[8]._M_parent[1]._M_left;
          }
          if (local_1d0 != &local_1c0) {
            operator_delete(local_1d0.string_,
                            CONCAT17(local_1c0._M_local_buf[7],
                                     CONCAT16(local_1c0._M_local_buf[6],
                                              CONCAT15(local_1c0._M_local_buf[5],
                                                       CONCAT14(local_1c0._M_local_buf[4],
                                                                local_1c0._M_allocated_capacity.
                                                                _0_4_)))) + 1);
          }
          VVar45.map_ = VVar45.map_ + 1;
        } while (VVar45 != local_f8);
      }
      cmGeneratorTarget::GetPrecompileHeaders
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_b8,this->GT,this->Config,(string *)__x);
      paVar48 = paStack_b0;
      if (local_b8 != paStack_b0) {
        VVar45 = local_b8;
        do {
          (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                    ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1d0,this,
                     (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)VVar45.map_);
          std::
          vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
          ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                    ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                      *)&iVar27._M_node[7]._M_parent,
                     (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1d0);
          if (local_1d0 != &local_1c0) {
            operator_delete(local_1d0.string_,
                            CONCAT17(local_1c0._M_local_buf[7],
                                     CONCAT16(local_1c0._M_local_buf[6],
                                              CONCAT15(local_1c0._M_local_buf[5],
                                                       CONCAT14(local_1c0._M_local_buf[4],
                                                                local_1c0._M_allocated_capacity.
                                                                _0_4_)))) + 1);
          }
          VVar45.string_ = (char *)(VVar45.int_ + 0x30);
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)VVar45.int_ != paVar48);
      }
      pBVar34 = cmGeneratorTarget::GetLanguageStandardProperty(this->GT,(string *)__x,this->Config);
      if (pBVar34 !=
          (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          0x0) {
        paVar48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pBVar34->Backtraces).
                     super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pBVar34->Backtraces).
                      super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
        local_f0 = pBVar34;
        if (paVar48 == local_f8) {
          pJVar47 = (pointer)0x0;
          local_298 = (pointer)0x0;
          pJVar39 = (pointer)0x0;
        }
        else {
          pJVar47 = (pointer)0x0;
          local_298 = (pointer)0x0;
          pJVar52 = (pointer)0x0;
          do {
            paVar49 = paVar48;
            JVar17 = BacktraceData::Add((BacktraceData *)local_88,(cmListFileBacktrace *)paVar48);
            if (pJVar47 == local_298) {
              lVar40 = (long)pJVar47 - (long)pJVar52;
              if (lVar40 == 0x7ffffffffffffffc) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar35 = lVar40 >> 2;
              uVar54 = uVar35;
              if (pJVar47 == pJVar52) {
                uVar54 = 1;
              }
              this_02 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                         *)(uVar54 + uVar35);
              if ((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                   *)0x1ffffffffffffffe < this_02) {
                this_02 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                           *)0x1fffffffffffffff;
              }
              if (CARRY8(uVar54,uVar35)) {
                this_02 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                           *)0x1fffffffffffffff;
              }
              pJVar39 = std::
                        _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                        ::_M_allocate(this_02,(size_t)paVar49);
              *(ArrayIndex *)((long)pJVar39 + lVar40) = JVar17.Index;
              pJVar46 = pJVar39;
              for (pJVar36 = pJVar52; pJVar47 != pJVar36; pJVar36 = pJVar36 + 1) {
                pJVar46->Index = pJVar36->Index;
                pJVar46 = pJVar46 + 1;
              }
              if (pJVar52 != (pointer)0x0) {
                operator_delete(pJVar52,(long)local_298 - (long)pJVar52);
              }
              local_298 = pJVar39 + (long)this_02;
            }
            else {
              pJVar47->Index = JVar17.Index;
              pJVar46 = pJVar47;
              pJVar39 = pJVar52;
            }
            pJVar47 = pJVar46 + 1;
            paVar48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar48->_M_local_buf + 0x10);
            pJVar52 = pJVar39;
          } while (paVar48 != local_f8);
        }
        local_220.string_ = (char *)&local_210;
        pcVar50 = (local_f0->Value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_220,pcVar50,
                   (pointer)((long)&((_Base_ptr)(local_f0->Value)._M_string_length)->_M_color +
                            (long)pcVar50));
        local_1b0._0_8_ =
             std::
             _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
             ::_M_allocate((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                            *)((long)pJVar47 - (long)pJVar39 >> 2),(size_t)pcVar50);
        local_1b0._8_8_ = local_1b0._0_8_;
        for (pJVar52 = pJVar39; pJVar52 != pJVar47; pJVar52 = pJVar52 + 1) {
          *(ArrayIndex *)&((cmGeneratorTarget *)local_1b0._8_8_)->Target = pJVar52->Index;
          local_1b0._8_8_ = (long)&((cmGeneratorTarget *)local_1b0._8_8_)->Target + 4;
        }
        local_1d0.string_ = (char *)&local_1c0;
        local_1c0._M_local_buf[5] = (char)((uint7)local_210._1_7_ >> 0x20);
        local_1c0._M_local_buf[6] = (char)((uint7)local_210._1_7_ >> 0x28);
        local_1c0._M_local_buf[7] = (char)((uint7)local_210._1_7_ >> 0x30);
        if (local_220 == &local_210) {
          local_1c0._M_allocated_capacity._0_4_ =
               (undefined4)CONCAT71(local_210._1_7_,local_210._M_local_buf[0]);
          local_1c0._8_5_ = (undefined5)local_210._8_8_;
          local_1c0._M_local_buf[0xd] = (char)((ulong)local_210._8_8_ >> 0x28);
          local_1c0._14_2_ = (undefined2)((ulong)local_210._8_8_ >> 0x30);
        }
        else {
          local_1d0.int_ = local_220.int_;
          local_1c0._M_allocated_capacity._0_4_ =
               (undefined4)CONCAT71(local_210._1_7_,local_210._M_local_buf[0]);
        }
        local_1c0._M_local_buf[4] = (char)((uint7)local_210._1_7_ >> 0x18);
        local_1b0._16_8_ = local_1b0._0_8_ + ((long)pJVar47 - (long)pJVar39);
        local_1c8 = local_218;
        local_218.int_ = 0;
        local_210._M_local_buf[0] = '\0';
        local_220.string_ = (char *)&local_210;
        if (pJVar39 != (pointer)0x0) {
          operator_delete(pJVar39,(long)local_298 - (long)pJVar39);
        }
        std::__cxx11::string::operator=((string *)(iVar27._M_node + 4),(string *)&local_1d0.bool_);
        pvVar4 = *(void **)(iVar27._M_node + 5);
        p_Var26 = iVar27._M_node[5]._M_left;
        *(undefined8 *)(iVar27._M_node + 5) = local_1b0._0_8_;
        iVar27._M_node[5]._M_parent = (_Base_ptr)local_1b0._8_8_;
        iVar27._M_node[5]._M_left = (_Base_ptr)local_1b0._16_8_;
        local_1b0._0_8_ = (cmGeneratorTarget *)0x0;
        local_1b0._8_8_ = (string *)0x0;
        local_1b0._16_8_ = (pointer)0x0;
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,(long)p_Var26 - (long)pvVar4);
        }
        if ((cmGeneratorTarget *)local_1b0._0_8_ != (cmGeneratorTarget *)0x0) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ - local_1b0._0_8_);
        }
        if (local_1d0 != &local_1c0) {
          operator_delete(local_1d0.string_,
                          CONCAT17(local_1c0._M_local_buf[7],
                                   CONCAT16(local_1c0._M_local_buf[6],
                                            CONCAT15(local_1c0._M_local_buf[5],
                                                     CONCAT14(local_1c0._M_local_buf[4],
                                                              local_1c0._M_allocated_capacity._0_4_)
                                                    ))) + 1);
        }
      }
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_b8);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_1f8);
      std::
      _Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_288);
      p_Var26 = (_Base_ptr)std::_Rb_tree_increment(local_90);
    } while (p_Var26 != &local_250);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_258);
  Json::Value::Value((Value *)&local_288,arrayValue);
  pKVar37 = cmGeneratorTarget::GetKindedSources(this->GT,this->Config);
  sk = (pKVar37->Sources).
       super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pSVar5 = (pKVar37->Sources).
           super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (sk != pSVar5) {
    do {
      si = Json::Value::size((Value *)&local_288);
      DumpSource((Value *)&local_1d0,this,sk,si);
      Json::Value::append((Value *)&local_288,(Value *)&local_1d0);
      Json::Value::~Value((Value *)&local_1d0);
      sk = sk + 1;
    } while (sk != pSVar5);
  }
  pVVar19 = Json::Value::operator[](__return_storage_ptr__,"sources");
  Json::Value::operator=(pVVar19,(Value *)&local_288);
  Json::Value::~Value((Value *)&local_288);
  Json::Value::Value((Value *)&local_b8,nullValue);
  local_1c0._M_allocated_capacity._0_4_ = 0x444c4f46;
  local_1c0._M_local_buf[4] = 'E';
  local_1c0._M_local_buf[5] = 'R';
  local_1c8 = (ValueHolder)0x6;
  local_1c0._M_local_buf[6] = '\0';
  local_1d0.string_ = (char *)&local_1c0;
  cVar24 = cmGeneratorTarget::GetProperty(this->GT,(string *)&local_1d0);
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0.string_,
                    CONCAT17(local_1c0._M_local_buf[7],
                             CONCAT16(local_1c0._M_local_buf[6],
                                      CONCAT15(local_1c0._M_local_buf[5],
                                               CONCAT14(local_1c0._M_local_buf[4],
                                                        local_1c0._M_allocated_capacity._0_4_)))) +
                    1);
  }
  if (cVar24.Value != (string *)0x0) {
    Json::Value::Value((Value *)&local_1d0,objectValue);
    Json::Value::operator=((Value *)&local_b8,(Value *)&local_1d0);
    Json::Value::~Value((Value *)&local_1d0);
    Json::Value::Value((Value *)&local_1d0,cVar24.Value);
    pVVar19 = Json::Value::operator[]((Value *)&local_b8,"name");
    Json::Value::operator=(pVVar19,(Value *)&local_1d0);
    Json::Value::~Value((Value *)&local_1d0);
  }
  bVar14 = Json::Value::isNull((Value *)&local_b8);
  if (!bVar14) {
    pVVar19 = Json::Value::operator[](__return_storage_ptr__,"folder");
    Json::Value::operator=(pVVar19,(Value *)&local_b8);
  }
  Json::Value::Value(&local_58,arrayValue);
  value = (this->SourceGroups).
          super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pSVar6 = (this->SourceGroups).
           super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (value != pSVar6) {
    do {
      Json::Value::Value((Value *)&local_288,objectValue);
      Json::Value::Value((Value *)&local_1d0,&value->Name);
      pVVar19 = Json::Value::operator[]((Value *)&local_288,"name");
      Json::Value::operator=(pVVar19,(Value *)&local_1d0);
      Json::Value::~Value((Value *)&local_1d0);
      pVVar19 = Json::Value::operator[]((Value *)&local_288,"sourceIndexes");
      Json::Value::operator=(pVVar19,&value->SourceIndexes);
      Json::Value::append(&local_58,(Value *)&local_288);
      Json::Value::~Value((Value *)&local_288);
      value = value + 1;
    } while (value != pSVar6);
  }
  bVar14 = Json::Value::empty(&local_58);
  if (!bVar14) {
    pVVar19 = Json::Value::operator[](__return_storage_ptr__,"sourceGroups");
    Json::Value::operator=(pVVar19,&local_58);
  }
  Json::Value::Value(&local_80,arrayValue);
  paVar48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(this->CompileGroups).
               super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(this->CompileGroups).
                super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  if (paVar48 != local_88) {
    local_90 = (_Rb_tree_node_base *)&this->CompileDataMap;
    local_e8 = &(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      pJVar61 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)paVar48->_M_allocated_capacity;
      local_1d0.string_ = (char *)&local_1c0;
      local_1c8 = (ValueHolder)0x0;
      local_1c0._M_allocated_capacity._0_4_ = local_1c0._M_allocated_capacity._0_4_ & 0xffffff00;
      local_1b0._0_8_ = local_1b0 + 0x10;
      local_1b0._8_8_ = (string *)0x0;
      local_1b0._16_8_ = local_1b0._16_8_ & 0xffffffffffffff00;
      local_288.string_ = (char *)&aStack_278;
      uVar54 = aStack_278._M_allocated_capacity >> 8;
      aStack_278._M_allocated_capacity = uVar54 << 8;
      VVar45.string_ = (char *)&local_180;
      local_180._M_p = (pointer)aStack_278._M_allocated_capacity;
      pVStack_178 = (ValueHolder *)aStack_278._8_8_;
      local_190._8_8_ = 0;
      local_280.int_ = 0;
      aStack_278._M_allocated_capacity = uVar54 << 8;
      local_100 = (pointer)0x0;
      local_110 = (pointer)0x0;
      cStack_108._M_current = (pointer)0x0;
      local_120 = (pointer)0x0;
      _Stack_118._M_nxt = (_Hash_node_base *)0x0;
      local_140._16_8_ = (pointer)0x0;
      pJStack_128 = (pointer)0x0;
      local_140._0_8_ =
           (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
           0x0;
      local_140._8_8_ =
           (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
           0x0;
      vStack_158.
      super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_158.
      super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_160 = (pointer)0x0;
      vStack_158.
      super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_170._M_allocated_capacity = 0;
      local_170._8_8_ = (pointer)0x0;
      local_190._M_allocated_capacity = (size_type)VVar45.string_;
      local_f8 = paVar48;
      std::__cxx11::string::_M_assign((string *)&local_1d0.bool_);
      pJVar56 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_140._8_8_;
      if (local_1c8 != (ValueHolder)0x0) {
        iVar27 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                 ::lower_bound((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                                *)local_90,(key_type *)&local_1d0);
        if ((iVar27._M_node == local_e8) ||
           (iVar16 = std::__cxx11::string::compare((string *)&local_1d0.bool_), iVar16 < 0)) {
          std::__throw_out_of_range("map::at");
        }
        p_Var29 = iVar27._M_node + 3;
        std::__cxx11::string::_M_assign((string *)local_1b0);
        if ((pointer *)&iVar27._M_node[7]._M_parent != &pJStack_128) {
          p_Var26 = iVar27._M_node[7]._M_parent;
          p_Var42 = iVar27._M_node[7]._M_left;
          local_f0 = (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)p_Var42 - (long)p_Var26);
          if ((BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)_Stack_118._M_nxt - (long)pJStack_128) < local_f0) {
            pJVar38 = std::
                      _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::_M_allocate((_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)(((long)local_f0 >> 3) * -0x3333333333333333),(size_t)p_Var29
                                   );
            local_228 = pJVar38;
            pJVar58 = local_120;
            pBVar34 = local_f0;
            for (; local_120 = pJVar58, local_f0 = pBVar34, p_Var26 != p_Var42;
                p_Var26 = (_Base_ptr)&p_Var26[1]._M_parent) {
              (pJVar38->Value)._M_dataplus._M_p = (pointer)&(pJVar38->Value).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)pJVar38,*(long *)p_Var26,
                         (long)&p_Var26->_M_parent->_M_color + *(long *)p_Var26);
              (pJVar38->Backtrace).Index = p_Var26[1]._M_color;
              pJVar38 = pJVar38 + 1;
              pJVar58 = local_120;
              pBVar34 = local_f0;
            }
            if (pJStack_128 != pJVar58) {
              paVar48 = &(pJStack_128->Value).field_2;
              do {
                plVar7 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(paVar48 + -1))->_M_dataplus)._M_p;
                if (paVar48 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar7) {
                  operator_delete(plVar7,paVar48->_M_allocated_capacity + 1);
                }
                pJVar38 = (pointer)((long)paVar48 + 0x18);
                paVar48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)paVar48 + 0x28);
              } while (pJVar38 != pJVar58);
            }
            if (pJStack_128 != (pointer)0x0) {
              operator_delete(pJStack_128,(long)_Stack_118._M_nxt - (long)pJStack_128);
            }
            pJStack_128 = local_228;
            _Stack_118._M_nxt =
                 (_Hash_node_base *)
                 ((long)&(pBVar34->Value)._M_dataplus._M_p +
                 (long)&(local_228->Value)._M_dataplus._M_p);
          }
          else {
            pBVar34 = (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((long)local_120 - (long)pJStack_128);
            if (pBVar34 < local_f0) {
              if (0 < (long)pBVar34) {
                lVar40 = (ulong)pBVar34 / 0x28 + 1;
                pJVar38 = pJStack_128;
                do {
                  std::__cxx11::string::_M_assign((string *)pJVar38);
                  (pJVar38->Backtrace).Index = p_Var26[1]._M_color;
                  p_Var26 = (_Base_ptr)&p_Var26[1]._M_parent;
                  pJVar38 = pJVar38 + 1;
                  lVar40 = lVar40 + -1;
                } while (1 < lVar40);
              }
              p_Var26 = iVar27._M_node[7]._M_left;
              local_228 = local_120;
              pJVar38 = local_120;
              for (p_Var42 = (_Base_ptr)
                             (((long)local_120 - (long)pJStack_128) +
                             (long)iVar27._M_node[7]._M_parent); p_Var42 != p_Var26;
                  p_Var42 = (_Base_ptr)&p_Var42[1]._M_parent) {
                (pJVar38->Value)._M_dataplus._M_p = (pointer)&(pJVar38->Value).field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)pJVar38,*(long *)p_Var42,
                           (long)&p_Var42->_M_parent->_M_color + *(long *)p_Var42);
                (pJVar38->Backtrace).Index = p_Var42[1]._M_color;
                pJVar38 = pJVar38 + 1;
              }
            }
            else {
              pJVar38 = pJStack_128;
              if (0 < (long)local_f0) {
                lVar40 = (ulong)local_f0 / 0x28 + 1;
                do {
                  std::__cxx11::string::_M_assign((string *)pJVar38);
                  (pJVar38->Backtrace).Index = p_Var26[1]._M_color;
                  p_Var26 = (_Base_ptr)&p_Var26[1]._M_parent;
                  pJVar38 = pJVar38 + 1;
                  lVar40 = lVar40 + -1;
                } while (1 < lVar40);
              }
              pJVar58 = local_120;
              if (pJVar38 != local_120) {
                paVar48 = &(pJVar38->Value).field_2;
                do {
                  plVar7 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(paVar48 + -1))->_M_dataplus)._M_p;
                  if (paVar48 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar7) {
                    operator_delete(plVar7,paVar48->_M_allocated_capacity + 1);
                  }
                  pJVar38 = (pointer)((long)paVar48 + 0x18);
                  paVar48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)paVar48 + 0x28);
                } while (pJVar38 != pJVar58);
              }
            }
          }
          local_120 = (pointer)((long)&(pJStack_128->Value)._M_dataplus._M_p +
                               (long)&(local_f0->Value)._M_dataplus._M_p);
        }
        paVar48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(iVar27._M_node + 4);
        std::__cxx11::string::_M_assign((string *)local_190._M_local_buf);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(iVar27._M_node + 4) != &local_190) {
          p_Var26 = *(_Base_ptr *)(iVar27._M_node + 5);
          p_Var42 = iVar27._M_node[5]._M_parent;
          uVar54 = (long)p_Var42 - (long)p_Var26;
          if ((ulong)((long)local_160 - local_170._0_8_) < uVar54) {
            pJVar39 = std::
                      _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                      ::_M_allocate((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                                     *)((long)uVar54 >> 2),(size_t)paVar48);
            if (p_Var26 != p_Var42) {
              memcpy(pJVar39,p_Var26,(uVar54 - 4 & 0xfffffffffffffffc) + 4);
            }
            if ((pointer)local_170._M_allocated_capacity != (pointer)0x0) {
              operator_delete((void *)local_170._M_allocated_capacity,
                              (long)local_160 - local_170._0_8_);
            }
            local_160 = (pointer)((long)pJVar39 + uVar54);
            local_170._M_allocated_capacity = (size_type)pJVar39;
          }
          else if ((ulong)(local_170._8_8_ - local_170._0_8_) < uVar54) {
            if (local_170._8_8_ != local_170._M_allocated_capacity) {
              memmove((void *)local_170._M_allocated_capacity,p_Var26,
                      local_170._8_8_ - local_170._0_8_);
            }
            p_Var26 = iVar27._M_node[5]._M_parent;
            for (p_Var42 = (_Base_ptr)
                           ((local_170._8_8_ - local_170._0_8_) + *(long *)(iVar27._M_node + 5));
                p_Var42 != p_Var26; p_Var42 = (_Base_ptr)&p_Var42->field_0x4) {
              ((pointer)local_170._8_8_)->Index = p_Var42->_M_color;
              local_170._8_8_ = local_170._8_8_ + 4;
            }
          }
          else if (p_Var42 != p_Var26) {
            memmove((void *)local_170._M_allocated_capacity,p_Var26,uVar54);
          }
          local_170._8_8_ = uVar54 + local_170._M_allocated_capacity;
        }
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::reserve(&vStack_158,
                  ((long)(pJVar61[3].Value.field_2._M_allocated_capacity -
                         pJVar61[3].Value._M_string_length) >> 3) * -0x3333333333333333 +
                  (*(long *)(iVar27._M_node + 6) - (long)iVar27._M_node[5]._M_right >> 3) *
                  -0x3333333333333333);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&vStack_158,
                   (const_iterator)
                   vStack_158.
                   super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)iVar27._M_node[5]._M_right,
                   *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)(iVar27._M_node + 6));
        pJVar38 = vStack_158.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&vStack_158,
                   (const_iterator)
                   vStack_158.
                   super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)pJVar61[3].Value._M_string_length,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)pJVar61[3].Value.field_2._M_allocated_capacity);
        cVar12._M_current = cStack_108._M_current;
        pIVar31 = local_110;
        __alloc = (_Tp_alloc_type *)0xaaaaaaaaaaaaaaab;
        p_Var55 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                   *)(((long)iVar27._M_node[8]._M_parent - *(long *)(iVar27._M_node + 8) >> 4) *
                      -0x5555555555555555 +
                     ((long)(pJVar61[5].Value._M_string_length -
                            (long)pJVar61[5].Value._M_dataplus._M_p) >> 4) * -0x5555555555555555);
        if ((_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
             *)0x2aaaaaaaaaaaaaa < p_Var55) {
          std::__throw_length_error("vector::reserve");
        }
        if ((_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
             *)(((long)local_100 - (long)local_110 >> 4) * -0x5555555555555555) < p_Var55) {
          __result = std::
                     _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                     ::_M_allocate(p_Var55,(size_t)pJVar38);
          std::
          vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
          ::_S_relocate(local_110,cStack_108._M_current,__result,__alloc);
          if (local_110 != (pointer)0x0) {
            operator_delete(local_110,(long)local_100 - (long)local_110);
          }
          cStack_108._M_current =
               (IncludeEntry *)(((long)cVar12._M_current - (long)pIVar31) + (long)__result);
          local_100 = __result + (long)p_Var55;
          local_110 = __result;
        }
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>,void>
                  ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                    *)&local_110,cStack_108,(IncludeEntry *)pJVar61[5].Value._M_dataplus._M_p,
                   (IncludeEntry *)pJVar61[5].Value._M_string_length);
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>,void>
                  ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                    *)&local_110,cStack_108,*(IncludeEntry **)(iVar27._M_node + 8),
                   (IncludeEntry *)iVar27._M_node[8]._M_parent);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::reserve((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_140,
                  ((long)pJVar61[4].Value._M_dataplus._M_p - *(long *)&pJVar61[3].Backtrace >> 3) *
                  -0x3333333333333333 +
                  ((long)iVar27._M_node[6]._M_right - (long)iVar27._M_node[6]._M_left >> 3) *
                  -0x3333333333333333);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)local_140,(const_iterator)local_140._8_8_,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)iVar27._M_node[6]._M_left,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)iVar27._M_node[6]._M_right);
        VVar45 = *(ValueHolder *)(pJVar61 + 4);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)local_140,(const_iterator)local_140._8_8_,
                   *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)&pJVar61[3].Backtrace,
                   (__normal_iterator<const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    )VVar45);
        uVar11 = local_140._8_8_;
        uVar30 = local_140._0_8_;
        if (local_140._0_8_ != local_140._8_8_) {
          lVar40 = ((long)(local_140._8_8_ - local_140._0_8_) >> 3) * -0x3333333333333333;
          VVar45.int_ = -(lVar40 + 1 >> 0x3f);
          local_288.string_ = VVar45.string_ + lVar40 + 1 >> 1;
          VVar44.int_ = local_288.int_;
          if (0x333333333333332 < local_288.int_) {
            VVar44.string_ = (char *)0x333333333333333;
          }
          local_280.int_ = 0;
          aStack_278._M_allocated_capacity = 0;
          VVar59.string_ = (char *)&local_258;
          do {
            if (VVar44.int_ < 1) {
              pJVar56 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x0;
              VVar60.int_ = 0;
              break;
            }
            pJVar41 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)operator_new(VVar44.int_ * 0x28,(nothrow_t *)&std::nothrow);
            pJVar56 = pJVar41;
            VVar60 = VVar44;
            if (pJVar41 ==
                (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
              pJVar56 = pJVar61;
              VVar60 = VVar59;
              if (VVar44 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&DAT_00000001) {
                VVar44.int_ = 0;
              }
              else {
                VVar44.string_ =
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&(VVar44.map_)->_M_t)->_M_local_buf + 1 >> 1;
              }
            }
            pJVar61 = pJVar56;
            VVar59 = VVar60;
          } while (pJVar41 ==
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x0);
          VVar44 = local_280;
          uVar13 = aStack_278._M_allocated_capacity;
          if ((pJVar56 !=
               (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x0) &&
             (VVar44 = VVar60, uVar13 = pJVar56,
             VVar60 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0)) {
            paVar48 = &(pJVar56->Value).field_2;
            (pJVar56->Value)._M_dataplus._M_p = (pointer)paVar48;
            pcVar50 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar30)
                      ->_M_dataplus)._M_p;
            paVar49 = &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar30)
                       ->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar50 == paVar49) {
              uVar9 = *(undefined8 *)
                       ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )uVar30)->field_2 + 8);
              paVar48->_M_allocated_capacity = paVar49->_M_allocated_capacity;
              *(undefined8 *)((long)&(pJVar56->Value).field_2 + 8) = uVar9;
            }
            else {
              (pJVar56->Value)._M_dataplus._M_p = pcVar50;
              (pJVar56->Value).field_2._M_allocated_capacity = paVar49->_M_allocated_capacity;
            }
            VVar45 = (ValueHolder)
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar30)->
                     _M_string_length;
            (pJVar56->Value)._M_string_length = (size_type)VVar45;
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar30)->
            _M_dataplus)._M_p = (pointer)paVar49;
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar30)->
            _M_string_length = 0;
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar30)->field_2)
            ._M_local_buf[0] = '\0';
            (pJVar56->Backtrace).Index = ((JBTIndex *)(uVar30 + 0x20))->Index;
            if (VVar60 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)&DAT_00000001) {
              lVar40 = VVar60.int_ * 0x28 + -0x28;
              paVar48 = &pJVar56[1].Value.field_2;
              do {
                paVar49 = paVar48;
                *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)(paVar49->_M_local_buf + -0x10) = paVar49;
                psVar1 = (size_type *)(paVar49->_M_local_buf + -0x28);
                if (psVar1 == *(size_type **)(paVar49->_M_local_buf + -0x38)) {
                  paVar49->_M_allocated_capacity = *psVar1;
                  *(undefined8 *)(paVar49->_M_local_buf + 8) =
                       *(undefined8 *)(paVar49->_M_local_buf + -0x20);
                }
                else {
                  *(size_type **)(paVar49->_M_local_buf + -0x10) =
                       *(size_type **)(paVar49->_M_local_buf + -0x38);
                  paVar49->_M_allocated_capacity = *(size_type *)(paVar49->_M_local_buf + -0x28);
                }
                *(undefined8 *)(paVar49->_M_local_buf + -8) =
                     *(undefined8 *)(paVar49->_M_local_buf + -0x30);
                *(size_type **)(paVar49->_M_local_buf + -0x38) = psVar1;
                *(char *)((long)paVar49 + -0x30) = '\0';
                *(char *)((long)paVar49 + -0x2f) = '\0';
                *(char *)((long)paVar49 + -0x2e) = '\0';
                *(char *)((long)paVar49 + -0x2d) = '\0';
                *(char *)((long)paVar49 + -0x2c) = '\0';
                *(char *)((long)paVar49 + -0x2b) = '\0';
                *(char *)((long)paVar49 + -0x2a) = '\0';
                *(char *)((long)paVar49 + -0x29) = '\0';
                paVar49->_M_local_buf[-0x28] = '\0';
                VVar45.int_._4_4_ = 0;
                VVar45.int_._0_4_ = *(uint *)(paVar49->_M_local_buf + -0x18);
                *(uint *)(paVar49->_M_local_buf + 0x10) = *(uint *)(paVar49->_M_local_buf + -0x18);
                lVar40 = lVar40 + -0x28;
                paVar48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar49->_M_local_buf + 0x28);
              } while (lVar40 != 0);
              pJVar56 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(paVar49->_M_local_buf + -0x10);
            }
            std::__cxx11::string::operator=((string *)uVar30,(string *)pJVar56);
            ((JBTIndex *)(uVar30 + 0x20))->Index = (pJVar56->Backtrace).Index;
          }
          aStack_278._M_allocated_capacity = uVar13;
          local_280 = VVar44;
          if ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)aStack_278._M_allocated_capacity ==
              (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0) {
            std::
            __inplace_stable_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)((anonymous_namespace)::JBT<std::__cxx11::string>const&,(anonymous_namespace)::JBT<std::__cxx11::string>const&)>>
                      ((__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        )uVar30,(__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 )uVar11,
                       (_Iter_comp_iter<bool_(*)(const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                        )0x48bdbe);
          }
          else {
            VVar45 = local_280;
            std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,(anonymous_namespace)::JBT<std::__cxx11::string>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)((anonymous_namespace)::JBT<std::__cxx11::string>const&,(anonymous_namespace)::JBT<std::__cxx11::string>const&)>>
                      ((__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        )uVar30,(__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 )uVar11,
                       (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)aStack_278._M_allocated_capacity,local_280.int_,
                       (_Iter_comp_iter<bool_(*)(const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                        )0x48bdbe);
          }
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Temporary_buffer
                    ((_Temporary_buffer<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_288);
        }
        pJVar41 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_140._8_8_;
        pJVar61 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_140._0_8_;
        pJVar56 = pJVar41;
        if (local_140._0_8_ != local_140._8_8_) {
          do {
            pJVar57 = pJVar61;
            pJVar61 = pJVar57 + 1;
            pJVar56 = pJVar41;
            if (pJVar61 == pJVar41) break;
            bVar14 = JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::ValueEq(pJVar57,pJVar61);
            pJVar56 = pJVar57;
          } while (!bVar14);
        }
        if (pJVar56 != pJVar41) {
          pJVar61 = pJVar56 + 2;
          for (; pJVar61 != pJVar41; pJVar61 = pJVar61 + 1) {
            bVar14 = JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::ValueEq(pJVar56,pJVar61);
            pJVar57 = pJVar56;
            if (!bVar14) {
              pJVar57 = pJVar56 + 1;
              std::__cxx11::string::operator=((string *)pJVar57,(string *)pJVar61);
              pJVar56[1].Backtrace.Index = (pJVar61->Backtrace).Index;
            }
            pJVar56 = pJVar57;
          }
          pJVar41 = pJVar56 + 1;
        }
        uVar30 = local_140._8_8_;
        pJVar56 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_140._8_8_;
        if (pJVar41 !=
            (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
            )local_140._8_8_) {
          paVar48 = &(pJVar41->Value).field_2;
          do {
            pcVar50 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (paVar48 + -1))->_M_dataplus)._M_p;
            if (paVar48 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar50) {
              operator_delete(pcVar50,paVar48->_M_allocated_capacity + 1);
            }
            pJVar61 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((long)paVar48 + 0x18);
            paVar48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar48 + 0x28);
            pJVar56 = pJVar41;
          } while (pJVar61 !=
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)uVar30);
        }
      }
      local_140._8_8_ = pJVar56;
      Json::Value::Value((Value *)&local_1f8,objectValue);
      psVar18 = extraout_RDX_03;
      if (local_1c8 != (ValueHolder)0x0) {
        Json::Value::Value((Value *)&local_288,(String *)&local_1d0);
        pVVar19 = Json::Value::operator[]((Value *)&local_1f8,"language");
        Json::Value::operator=(pVVar19,(Value *)&local_288);
        Json::Value::~Value((Value *)&local_288);
        psVar18 = extraout_RDX_04;
      }
      paVar48 = local_f8;
      if ((string *)local_1b0._8_8_ != (string *)0x0) {
        DumpSysroot((Value *)&local_288,(Target *)local_1b0,psVar18);
        pVVar19 = Json::Value::operator[]((Value *)&local_1f8,"sysroot");
        Json::Value::operator=(pVVar19,(Value *)&local_288);
        Json::Value::~Value((Value *)&local_288);
      }
      if (vStack_158.
          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          vStack_158.
          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        Json::Value::Value((Value *)&local_258,arrayValue);
        pJVar38 = vStack_158.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (this_03 = (Target *)
                       vStack_158.
                       super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_03 != (Target *)pJVar38;
            this_03 = (Target *)((this_03->TopSource).field_2._M_local_buf + 8)) {
          local_218.int_ = 0;
          local_210._M_local_buf[0] = '\0';
          local_220.string_ = (char *)&local_210;
          DumpCommandFragment((Value *)&local_288,this_03,
                              (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_220,(string *)VVar45.map_);
          Json::Value::append((Value *)&local_258,(Value *)&local_288);
          Json::Value::~Value((Value *)&local_288);
          if (local_220 != &local_210) {
            operator_delete(local_220.string_,
                            CONCAT71(local_210._1_7_,local_210._M_local_buf[0]) + 1);
          }
        }
        pVVar19 = Json::Value::operator[]((Value *)&local_1f8,"compileCommandFragments");
        Json::Value::operator=(pVVar19,(Value *)&local_258);
        Json::Value::~Value((Value *)&local_258);
      }
      if (local_110 != cStack_108._M_current) {
        Json::Value::Value((Value *)&local_258,arrayValue);
        cVar12._M_current = cStack_108._M_current;
        for (pIVar31 = local_110; pIVar31 != cVar12._M_current; pIVar31 = pIVar31 + 1) {
          Json::Value::Value((Value *)&local_220,objectValue);
          Json::Value::Value((Value *)&local_288,(String *)pIVar31);
          pVVar19 = Json::Value::operator[]((Value *)&local_220,"path");
          Json::Value::operator=(pVVar19,(Value *)&local_288);
          Json::Value::~Value((Value *)&local_288);
          JVar17.Index = extraout_EDX;
          if (pIVar31->IsSystem == true) {
            Json::Value::Value((Value *)&local_288,true);
            pVVar19 = Json::Value::operator[]((Value *)&local_220,"isSystem");
            Json::Value::operator=(pVVar19,(Value *)&local_288);
            Json::Value::~Value((Value *)&local_288);
            JVar17.Index = extraout_EDX_00;
          }
          AddBacktrace((Target *)&local_220,(Value *)(ulong)(pIVar31->Path).Backtrace.Index,JVar17);
          Json::Value::append((Value *)&local_258,(Value *)&local_220);
          Json::Value::~Value((Value *)&local_220);
        }
        pVVar19 = Json::Value::operator[]((Value *)&local_1f8,"includes");
        Json::Value::operator=(pVVar19,(Value *)&local_258);
        Json::Value::~Value((Value *)&local_258);
      }
      if (local_140._0_8_ != local_140._8_8_) {
        Json::Value::Value((Value *)&local_258,arrayValue);
        uVar30 = local_140._8_8_;
        for (pJVar61 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_140._0_8_;
            pJVar61 !=
            (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
            )uVar30; pJVar61 = pJVar61 + 1) {
          Json::Value::Value((Value *)&local_220,objectValue);
          Json::Value::Value((Value *)&local_288,&pJVar61->Value);
          pVVar19 = Json::Value::operator[]((Value *)&local_220,"define");
          Json::Value::operator=(pVVar19,(Value *)&local_288);
          Json::Value::~Value((Value *)&local_288);
          AddBacktrace((Target *)&local_220,(Value *)(ulong)(pJVar61->Backtrace).Index,bt);
          Json::Value::append((Value *)&local_258,(Value *)&local_220);
          Json::Value::~Value((Value *)&local_220);
        }
        pVVar19 = Json::Value::operator[]((Value *)&local_1f8,"defines");
        Json::Value::operator=(pVVar19,(Value *)&local_258);
        Json::Value::~Value((Value *)&local_258);
      }
      if (pJStack_128 != local_120) {
        Json::Value::Value((Value *)&local_258,arrayValue);
        pJVar38 = local_120;
        for (pJVar58 = pJStack_128; pJVar58 != pJVar38; pJVar58 = pJVar58 + 1) {
          Json::Value::Value((Value *)&local_220,objectValue);
          Json::Value::Value((Value *)&local_288,&pJVar58->Value);
          pVVar19 = Json::Value::operator[]((Value *)&local_220,"header");
          Json::Value::operator=(pVVar19,(Value *)&local_288);
          Json::Value::~Value((Value *)&local_288);
          AddBacktrace((Target *)&local_220,(Value *)(ulong)(pJVar58->Backtrace).Index,bt_00);
          Json::Value::append((Value *)&local_258,(Value *)&local_220);
          Json::Value::~Value((Value *)&local_220);
        }
        pVVar19 = Json::Value::operator[]((Value *)&local_1f8,"precompileHeaders");
        Json::Value::operator=(pVVar19,(Value *)&local_258);
        Json::Value::~Value((Value *)&local_258);
      }
      if (local_190._8_8_ != 0) {
        Json::Value::Value((Value *)&local_220,objectValue);
        Json::Value::Value((Value *)&local_288,(String *)&local_190);
        pVVar19 = Json::Value::operator[]((Value *)&local_220,"standard");
        Json::Value::operator=(pVVar19,(Value *)&local_288);
        Json::Value::~Value((Value *)&local_288);
        if (local_170._M_allocated_capacity != local_170._8_8_) {
          Json::Value::Value((Value *)&local_288,arrayValue);
          uVar11 = local_170._8_8_;
          for (uVar30 = local_170._M_allocated_capacity; uVar30 != uVar11; uVar30 = uVar30 + 4) {
            Json::Value::Value((Value *)&local_258,((pointer)uVar30)->Index);
            Json::Value::append((Value *)&local_288,(Value *)&local_258);
            Json::Value::~Value((Value *)&local_258);
          }
          pVVar19 = Json::Value::operator[]((Value *)&local_220,"backtraces");
          Json::Value::operator=(pVVar19,(Value *)&local_288);
          Json::Value::~Value((Value *)&local_288);
        }
        pVVar19 = Json::Value::operator[]((Value *)&local_1f8,"languageStandard");
        Json::Value::operator=(pVVar19,(Value *)&local_220);
        Json::Value::~Value((Value *)&local_220);
      }
      CompileData::~CompileData((CompileData *)&local_1d0);
      pVVar19 = Json::Value::operator[]((Value *)&local_1f8,"sourceIndexes");
      Json::Value::operator=(pVVar19,(Value *)(paVar48->_M_local_buf + 8));
      Json::Value::append(&local_80,(Value *)&local_1f8);
      Json::Value::~Value((Value *)&local_1f8);
      paVar48 = paVar48 + 3;
    } while (paVar48 != local_88);
  }
  bVar14 = Json::Value::empty(&local_80);
  if (!bVar14) {
    pVVar19 = Json::Value::operator[](__return_storage_ptr__,"compileGroups");
    Json::Value::operator=(pVVar19,&local_80);
  }
  Json::Value::~Value(&local_80);
  Json::Value::~Value(&local_58);
  Json::Value::~Value((Value *)&local_b8);
  BacktraceData::Dump((Value *)&local_1d0,&this->Backtraces);
  pVVar19 = Json::Value::operator[](__return_storage_ptr__,"backtraceGraph");
  Json::Value::operator=(pVVar19,(Value *)&local_1d0);
  Json::Value::~Value((Value *)&local_1d0);
  Json::Value::~Value((Value *)&local_e0);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::Dump()
{
  Json::Value target = Json::objectValue;

  cmStateEnums::TargetType const type = this->GT->GetType();

  target["name"] = this->GT->GetName();
  target["type"] = cmState::GetTargetTypeName(type);
  target["id"] = TargetId(this->GT, this->TopBuild);
  target["paths"] = this->DumpPaths();
  if (this->GT->Target->GetIsGeneratorProvided()) {
    target["isGeneratorProvided"] = true;
  }

  this->AddBacktrace(target, this->GT->GetBacktrace());

  if (this->GT->Target->GetHaveInstallRule()) {
    target["install"] = this->DumpInstall();
  }

  if (this->GT->HaveWellDefinedOutputFiles()) {
    Json::Value artifacts = this->DumpArtifacts();
    if (!artifacts.empty()) {
      target["artifacts"] = std::move(artifacts);
    }
  }

  if (type == cmStateEnums::EXECUTABLE ||
      type == cmStateEnums::SHARED_LIBRARY ||
      type == cmStateEnums::MODULE_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["link"] = this->DumpLink();
  } else if (type == cmStateEnums::STATIC_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["archive"] = this->DumpArchive();
  }

  Json::Value dependencies = this->DumpDependencies();
  if (!dependencies.empty()) {
    target["dependencies"] = dependencies;
  }

  {
    this->ProcessLanguages();

    target["sources"] = this->DumpSources();

    Json::Value folder = this->DumpFolder();
    if (!folder.isNull()) {
      target["folder"] = std::move(folder);
    }

    Json::Value sourceGroups = this->DumpSourceGroups();
    if (!sourceGroups.empty()) {
      target["sourceGroups"] = std::move(sourceGroups);
    }

    Json::Value compileGroups = this->DumpCompileGroups();
    if (!compileGroups.empty()) {
      target["compileGroups"] = std::move(compileGroups);
    }
  }

  target["backtraceGraph"] = this->Backtraces.Dump();

  return target;
}